

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchronized_timer.cpp
# Opt level: O3

void __thiscall
jessilib::syncrhonized_timer::syncrhonized_timer
          (syncrhonized_timer *this,duration_t in_period,function_t *in_callback)

{
  _Manager_type p_Var1;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type local_70;
  _Any_data local_60;
  code *local_50;
  _Any_data local_40;
  code *local_30;
  cancel_token local_18;
  
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (_Manager_type)0x0;
  local_70 = in_callback->_M_invoker;
  p_Var1 = (in_callback->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_88._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(in_callback->super__Function_base)._M_functor;
    local_88._8_8_ = *(undefined8 *)((long)&(in_callback->super__Function_base)._M_functor + 8);
    (in_callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    in_callback->_M_invoker = (_Invoker_type)0x0;
    local_78 = p_Var1;
  }
  synchonrized_callback::synchonrized_callback
            ((synchonrized_callback *)&local_40,(function_t *)&local_88);
  std::function<void(jessilib::timer&)>::function<jessilib::synchonrized_callback,void>
            ((function<void(jessilib::timer&)> *)local_60._M_pod_data,
             (synchonrized_callback *)&local_40);
  timer::timer(&this->super_timer,in_period,(function_t *)&local_60);
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  cancel_token::~cancel_token(&local_18);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  if (local_78 != (_Manager_type)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  return;
}

Assistant:

syncrhonized_timer::syncrhonized_timer(duration_t in_period, function_t in_callback)
	: timer{ in_period, synchonrized_callback{ std::move(in_callback) } } {
	// Empty ctor body
}